

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawListFlags IVar1;
  bool bVar2;
  int iVar3;
  ImDrawList *pIVar4;
  ImDrawCmd *pIVar5;
  ImDrawVert *p;
  char *pcVar6;
  ImVector<unsigned_short> *lhs;
  char *local_2d0;
  uint local_2ac;
  ImVec2 *local_298;
  uint local_28c;
  long local_278;
  char *local_250;
  ImDrawListFlags backup_flags;
  ImDrawVert *local_228;
  ImDrawVert *v;
  int vtx_i;
  int n;
  ImVec2 triangles_pos [3];
  char *buf_end;
  char *buf_p;
  char buf [300];
  uint local_b4;
  int local_b0;
  int idx_i;
  int prim;
  undefined1 local_a0 [8];
  ImGuiListClipper clipper;
  int i;
  ImRect vtxs_rect;
  ImRect clip_rect;
  bool pcmd_node_open;
  ImDrawIdx *idx_buffer;
  ImDrawCmd *pcmd;
  ImVec2 IStack_48;
  int elem_offset;
  ImDrawList *local_40;
  ImDrawList *fg_draw_list;
  byte local_21;
  char *pcStack_20;
  bool node_open;
  char *label_local;
  ImDrawList *draw_list_local;
  ImGuiWindow *window_local;
  
  if (draw_list->_OwnerName == (char *)0x0) {
    local_250 = "";
  }
  else {
    local_250 = draw_list->_OwnerName;
  }
  pcStack_20 = label;
  label_local = (char *)draw_list;
  draw_list_local = (ImDrawList *)window;
  local_21 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,local_250,
                      (ulong)(uint)(draw_list->VtxBuffer).Size,
                      (ulong)(uint)(draw_list->IdxBuffer).Size,(draw_list->CmdBuffer).Size);
  pcVar6 = label_local;
  pIVar4 = GetWindowDrawList();
  if ((ImDrawList *)pcVar6 == pIVar4) {
    SameLine(0.0,-1.0);
    ImVec4::ImVec4((ImVec4 *)((long)&fg_draw_list + 4),1.0,0.4,0.4,1.0);
    TextColored((ImVec4 *)((long)&fg_draw_list + 4),"CURRENTLY APPENDING");
    if ((local_21 & 1) != 0) {
      TreePop();
    }
  }
  else {
    local_40 = ::GetForegroundDrawList((ImGuiWindow *)draw_list_local);
    if ((draw_list_local != (ImDrawList *)0x0) &&
       (bVar2 = IsItemHovered(0), pIVar4 = local_40, bVar2)) {
      lhs = &draw_list_local->IdxBuffer;
      IStack_48 = ::operator+((ImVec2 *)lhs,(ImVec2 *)&(draw_list_local->IdxBuffer).Data);
      ImDrawList::AddRect(pIVar4,(ImVec2 *)lhs,&stack0xffffffffffffffb8,0xff00ffff,0.0,0xf,1.0);
    }
    if ((local_21 & 1) != 0) {
      pcmd._4_4_ = 0;
      for (idx_buffer = (ImDrawIdx *)ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
          pIVar5 = ImVector<ImDrawCmd>::end((ImVector<ImDrawCmd> *)label_local), idx_buffer < pIVar5
          ; idx_buffer = idx_buffer + 0x18) {
        if ((*(long *)(idx_buffer + 0x10) != 0) || (*(int *)idx_buffer != 0)) {
          if (*(long *)(idx_buffer + 0x10) == 0) {
            if (*(int *)(label_local + 0x10) < 1) {
              local_278 = 0;
            }
            else {
              local_278 = *(long *)(label_local + 0x18);
            }
            stack0xffffffffffffffa0 = local_278;
            pIVar5 = ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
            pcVar6 = "non-indexed";
            if (0 < *(int *)(label_local + 0x10)) {
              pcVar6 = "indexed";
            }
            clip_rect.Max.x._3_1_ =
                 TreeNode((void *)(((long)idx_buffer - (long)pIVar5) / 0x30),
                          "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                          (double)*(float *)(idx_buffer + 2),(double)*(float *)(idx_buffer + 4),
                          (double)*(float *)(idx_buffer + 6),(double)*(float *)(idx_buffer + 8),
                          (ulong)*(uint *)idx_buffer,pcVar6,*(undefined8 *)(idx_buffer + 0xc));
            if ((((show_drawcmd_clip_rects & 1U) != 0) && (local_40 != (ImDrawList *)0x0)) &&
               (bVar2 = IsItemHovered(0), bVar2)) {
              ImRect::ImRect((ImRect *)&vtxs_rect.Max,(ImVec4 *)(idx_buffer + 2));
              ImRect::ImRect((ImRect *)&clipper.DisplayEnd);
              for (clipper.DisplayStart = pcmd._4_4_;
                  clipper.DisplayStart < pcmd._4_4_ + *(int *)idx_buffer;
                  clipper.DisplayStart = clipper.DisplayStart + 1) {
                if (stack0xffffffffffffffa0 == 0) {
                  local_28c = clipper.DisplayStart;
                }
                else {
                  local_28c = (uint)*(ushort *)
                                     (stack0xffffffffffffffa0 + (long)clipper.DisplayStart * 2);
                }
                p = ImVector<ImDrawVert>::operator[]
                              ((ImVector<ImDrawVert> *)(label_local + 0x20),local_28c);
                ImRect::Add((ImRect *)&clipper.DisplayEnd,&p->pos);
              }
              ImRect::Floor((ImRect *)&vtxs_rect.Max);
              ImDrawList::AddRect(local_40,&vtxs_rect.Max,&clip_rect.Min,0xff00ffff,0.0,0xf,1.0);
              ImRect::Floor((ImRect *)&clipper.DisplayEnd);
              ImDrawList::AddRect(local_40,(ImVec2 *)&clipper.DisplayEnd,&vtxs_rect.Min,0xffff00ff,
                                  0.0,0xf,1.0);
            }
            if ((clip_rect.Max.x._3_1_ & 1) != 0) {
              ImGuiListClipper::ImGuiListClipper
                        ((ImGuiListClipper *)local_a0,*(uint *)idx_buffer / 3,-1.0);
              while (bVar2 = ImGuiListClipper::Step((ImGuiListClipper *)local_a0), bVar2) {
                local_b4 = pcmd._4_4_ + clipper.ItemsCount * 3;
                for (local_b0 = clipper.ItemsCount; local_b0 < clipper.StepNo;
                    local_b0 = local_b0 + 1) {
                  buf_end = (char *)&buf_p;
                  local_298 = (ImVec2 *)&vtx_i;
                  do {
                    ImVec2::ImVec2(local_298);
                    local_298 = local_298 + 1;
                  } while (local_298 != triangles_pos + 2);
                  for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
                    if (stack0xffffffffffffffa0 == 0) {
                      local_2ac = local_b4;
                    }
                    else {
                      local_2ac = (uint)*(ushort *)
                                         (stack0xffffffffffffffa0 + (long)(int)local_b4 * 2);
                    }
                    v._0_4_ = local_2ac;
                    local_228 = ImVector<ImDrawVert>::operator[]
                                          ((ImVector<ImDrawVert> *)(label_local + 0x20),local_2ac);
                    *(ImVec2 *)(&vtx_i + (long)v._4_4_ * 2) = local_228->pos;
                    if (v._4_4_ == 0) {
                      local_2d0 = "idx";
                    }
                    else {
                      local_2d0 = "   ";
                    }
                    iVar3 = ImFormatString(buf_end,(size_t)(buf + (0x124 - (long)buf_end)),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           (double)(local_228->pos).x,(double)(local_228->pos).y,
                                           (double)(local_228->uv).x,(double)(local_228->uv).y,
                                           local_2d0,(ulong)local_b4,(ulong)local_228->col);
                    buf_end = buf_end + iVar3;
                    local_b4 = local_b4 + 1;
                  }
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdd0,0.0,0.0);
                  Selectable((char *)&buf_p,false,0,(ImVec2 *)&stack0xfffffffffffffdd0);
                  if ((local_40 != (ImDrawList *)0x0) && (bVar2 = IsItemHovered(0), bVar2)) {
                    IVar1 = local_40->Flags;
                    local_40->Flags = local_40->Flags & 0xfffffffe;
                    ImDrawList::AddPolyline(local_40,(ImVec2 *)&vtx_i,3,0xff00ffff,true,1.0);
                    local_40->Flags = IVar1;
                  }
                }
              }
              TreePop();
              ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_a0);
            }
          }
          else {
            BulletText("Callback %p, user_data %p",*(undefined8 *)(idx_buffer + 0x10),
                       *(undefined8 *)(idx_buffer + 0x14));
          }
        }
        pcmd._4_4_ = *(int *)idx_buffer + pcmd._4_4_;
      }
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "idx" : "   ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }